

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_partition_iterator.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::Set_partition_iterator::increment(Set_partition_iterator *this)

{
  value_type vVar1;
  uint uVar2;
  uint uVar3;
  reference pvVar4;
  bool bVar5;
  uint local_1c;
  uint p;
  uint mm;
  uint i;
  Set_partition_iterator *this_local;
  
  if (this->k_ < 2) {
    this->is_end_ = true;
  }
  else {
    p = this->n_;
    do {
      uVar3 = p;
      p = uVar3 - 1;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->rgs_,(ulong)p);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->max_,(ulong)p);
      bVar5 = true;
      if (vVar1 + 1 <= *pvVar4) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->rgs_,(ulong)p);
        bVar5 = this->k_ <= *pvVar4 + 1;
      }
    } while (bVar5);
    if (p == 0) {
      this->is_end_ = true;
    }
    else {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->rgs_,(ulong)p);
      *pvVar4 = *pvVar4 + 1;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->max_,(ulong)p);
      uVar2 = *pvVar4;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->rgs_,(ulong)p);
      uVar2 = (uVar2 <= *pvVar4) + uVar2;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->max_,(ulong)uVar3);
      *pvVar4 = uVar2;
      while (uVar3 = p + 1, uVar3 < this->n_) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->rgs_,(ulong)uVar3);
        *pvVar4 = 0;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->max_,(ulong)(p + 2));
        *pvVar4 = uVar2;
        p = uVar3;
      }
      local_1c = this->k_;
      p = uVar3;
      if (uVar2 < local_1c) {
        do {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->max_,(ulong)p);
          *pvVar4 = local_1c;
          p = p - 1;
          local_1c = local_1c - 1;
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->rgs_,(ulong)p);
          *pvVar4 = local_1c;
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->max_,(ulong)p);
        } while (*pvVar4 < local_1c);
      }
      update_value(this);
    }
  }
  return;
}

Assistant:

void increment() {
    if (k_ <= 1) {
      is_end_ = true;
      return;
    }
    uint i = n_ - 1;
    while (rgs_[i] + 1 > max_[i] || rgs_[i] + 1 >= k_) i--;
    if (i == 0) {
      is_end_ = true;
      return;
    }
    rgs_[i]++;
    uint mm = max_[i];
    mm += (rgs_[i] >= mm);
    max_[i + 1] = mm;
    while (++i < n_) {
      rgs_[i] = 0;
      max_[i + 1] = mm;
    }
    uint p = k_;
    if (mm < p) do {
        max_[i] = p;
        --i;
        --p;
        rgs_[i] = p;
      } while (max_[i] < p);
    update_value();
  }